

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLD3LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint Register_2;
  DecodeStatus DVar9;
  uint Register_1;
  uint Register;
  uint local_34;
  
  DVar9 = MCDisassembler_Fail;
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar7 = Insn >> 5 & 7;
    iVar8 = 1;
    goto LAB_00150071;
  case 1:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar7 = Insn >> 6 & 3;
    uVar5 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x30) != 0) {
      return MCDisassembler_Fail;
    }
    uVar7 = Insn >> 7 & 1;
    uVar5 = Insn & 0x40;
    break;
  case 3:
    goto switchD_0015000f_caseD_3;
  }
  iVar8 = 2 - (uint)(uVar5 == 0);
LAB_00150071:
  uVar5 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar1 = DPRDecoderTable[uVar5];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  DVar9 = MCDisassembler_Fail;
  if (uVar5 + iVar8 < 0x20) {
    uVar2 = DPRDecoderTable[uVar5 + iVar8];
    MCOperand_CreateReg0(Inst,(uint)uVar2);
    uVar5 = uVar5 + iVar8 * 2;
    if (uVar5 < 0x20) {
      uVar6 = Insn & 0xf;
      uVar3 = DPRDecoderTable[uVar5];
      MCOperand_CreateReg0(Inst,(uint)uVar3);
      uVar4 = GPRDecoderTable[Insn >> 0x10 & 0xf];
      MCOperand_CreateReg0(Inst,(uint)uVar4);
      if (uVar6 == 0xf) {
        MCOperand_CreateImm0(Inst,0);
      }
      else {
        MCOperand_CreateReg0(Inst,(uint)uVar4);
        MCOperand_CreateImm0(Inst,0);
        if (uVar6 == 0xd) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)GPRDecoderTable[uVar6];
        }
        MCOperand_CreateReg0(Inst,uVar5);
      }
      local_34 = (uint)uVar1;
      MCOperand_CreateReg0(Inst,local_34);
      MCOperand_CreateReg0(Inst,(uint)uVar2);
      MCOperand_CreateReg0(Inst,(uint)uVar3);
      MCOperand_CreateImm0(Inst,(ulong)uVar7);
      DVar9 = MCDisassembler_Success;
    }
  }
switchD_0015000f_caseD_3:
  return DVar9;
}

Assistant:

static DecodeStatus DecodeVLD3LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 4, 2))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}